

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O0

vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *
tinyusdz::lerp<tinyusdz::value::quatd>
          (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *a,
          vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *b,double t)

{
  unsigned_long *puVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference a_00;
  const_reference b_00;
  reference pvVar4;
  quatd local_78;
  ulong local_58;
  size_t i;
  size_type local_48;
  size_type local_40;
  size_type local_38;
  size_t n;
  double local_28;
  double t_local;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *b_local;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *a_local;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *dst;
  
  n._7_1_ = 0;
  local_28 = t;
  t_local = (double)b;
  b_local = a;
  a_local = __return_storage_ptr__;
  std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::vector
            (__return_storage_ptr__);
  local_40 = std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::size
                       (b_local);
  local_48 = std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::size
                       ((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                        t_local);
  puVar1 = std::min<unsigned_long>(&local_40,&local_48);
  local_38 = *puVar1;
  if (local_38 != 0) {
    std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::resize
              (__return_storage_ptr__,local_38);
    sVar2 = std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::size
                      (b_local);
    sVar3 = std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::size
                      ((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                       t_local);
    if (sVar2 == sVar3) {
      for (local_58 = 0; local_58 < local_38; local_58 = local_58 + 1) {
        a_00 = std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::
               operator[](b_local,local_58);
        b_00 = std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::
               operator[]((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *
                          )t_local,local_58);
        lerp<tinyusdz::value::quatd>(&local_78,a_00,b_00,local_28);
        pvVar4 = std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::
                 operator[](__return_storage_ptr__,local_58);
        (pvVar4->imag)._M_elems[0] = local_78.imag._M_elems[0];
        (pvVar4->imag)._M_elems[1] = local_78.imag._M_elems[1];
        (pvVar4->imag)._M_elems[2] = local_78.imag._M_elems[2];
        pvVar4->real = local_78.real;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}